

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

bool duckdb::BitpackingFun::TypeIsSupported(PhysicalType physical_type)

{
  uint uVar1;
  undefined7 in_register_00000039;
  
  uVar1 = (uint)CONCAT71(in_register_00000039,physical_type);
  if (((0x17 < uVar1) || ((0x8003feU >> (uVar1 & 0x1f) & 1) == 0)) && (1 < uVar1 - 0xcb)) {
    return false;
  }
  return true;
}

Assistant:

bool BitpackingFun::TypeIsSupported(const PhysicalType physical_type) {
	switch (physical_type) {
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
	case PhysicalType::INT16:
	case PhysicalType::INT32:
	case PhysicalType::INT64:
	case PhysicalType::UINT8:
	case PhysicalType::UINT16:
	case PhysicalType::UINT32:
	case PhysicalType::UINT64:
	case PhysicalType::LIST:
	case PhysicalType::INT128:
	case PhysicalType::UINT128:
		return true;
	default:
		return false;
	}
}